

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagate_filter.cpp
# Opt level: O2

void __thiscall
duckdb::StatisticsPropagator::UpdateFilterStatistics
          (StatisticsPropagator *this,Expression *left,Expression *right,
          ExpressionType comparison_type)

{
  ExpressionType EVar1;
  BoundColumnRefExpression *pBVar2;
  iterator iVar3;
  type pBVar4;
  BoundConstantExpression *pBVar5;
  BoundColumnRefExpression *pBVar6;
  iterator iVar7;
  type rstats;
  int iVar8;
  undefined7 in_register_00000009;
  StatisticsPropagator *pSVar9;
  optional_ptr<duckdb::BoundColumnRefExpression,_true> local_38;
  BoundConstantExpression *local_30;
  
  iVar8 = (int)CONCAT71(in_register_00000009,comparison_type);
  if ((iVar8 != 0x25) && (iVar8 != 0x28)) {
    if ((left->super_BaseExpression).type == BOUND_COLUMN_REF) {
      pBVar2 = BaseExpression::Cast<duckdb::BoundColumnRefExpression>(&left->super_BaseExpression);
      SetStatisticsNotNull(this,pBVar2->binding);
    }
    if ((right->super_BaseExpression).type == BOUND_COLUMN_REF) {
      pBVar2 = BaseExpression::Cast<duckdb::BoundColumnRefExpression>(&right->super_BaseExpression);
      SetStatisticsNotNull(this,pBVar2->binding);
    }
  }
  EVar1 = (left->super_BaseExpression).type;
  if (EVar1 == BOUND_COLUMN_REF) {
    EVar1 = (right->super_BaseExpression).type;
    if (EVar1 == BOUND_COLUMN_REF) {
      pBVar2 = BaseExpression::Cast<duckdb::BoundColumnRefExpression>(&left->super_BaseExpression);
      pBVar6 = BaseExpression::Cast<duckdb::BoundColumnRefExpression>(&right->super_BaseExpression);
      iVar3 = ::std::
              _Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(this->statistics_map)._M_h,&pBVar2->binding);
      iVar7 = ::std::
              _Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(this->statistics_map)._M_h,&pBVar6->binding);
      if (iVar7.
          super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_true>
          ._M_cur == (__node_type *)0x0 ||
          iVar3.
          super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        return;
      }
      pBVar4 = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
               ::operator*((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                            *)((long)iVar3.
                                     super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_true>
                                     ._M_cur + 0x18));
      pSVar9 = (StatisticsPropagator *)
               ((long)iVar7.
                      super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_true>
                      ._M_cur + 0x18);
      rstats = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
               ::operator*((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                            *)pSVar9);
      UpdateFilterStatistics(pSVar9,pBVar4,rstats,comparison_type);
      return;
    }
    if (EVar1 != VALUE_CONSTANT) {
      return;
    }
    local_38.ptr = BaseExpression::Cast<duckdb::BoundColumnRefExpression>
                             (&left->super_BaseExpression);
    local_30 = BaseExpression::Cast<duckdb::BoundConstantExpression>(&right->super_BaseExpression);
  }
  else {
    if (EVar1 != VALUE_CONSTANT) {
      return;
    }
    if ((right->super_BaseExpression).type != BOUND_COLUMN_REF) {
      return;
    }
    local_30 = BaseExpression::Cast<duckdb::BoundConstantExpression>(&left->super_BaseExpression);
    local_38.ptr = BaseExpression::Cast<duckdb::BoundColumnRefExpression>
                             (&right->super_BaseExpression);
    comparison_type = FlipComparisonExpression(comparison_type);
  }
  pBVar2 = optional_ptr<duckdb::BoundColumnRefExpression,_true>::operator->(&local_38);
  iVar3 = ::std::
          _Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->statistics_map)._M_h,&pBVar2->binding);
  if (iVar3.
      super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_true>
      ._M_cur != (__node_type *)0x0) {
    pBVar4 = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>::
             operator*((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                        *)((long)iVar3.
                                 super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_true>
                                 ._M_cur + 0x18));
    pSVar9 = (StatisticsPropagator *)&stack0xffffffffffffffd0;
    pBVar5 = optional_ptr<duckdb::BoundConstantExpression,_true>::operator->
                       ((optional_ptr<duckdb::BoundConstantExpression,_true> *)pSVar9);
    UpdateFilterStatistics(pSVar9,pBVar4,comparison_type,&pBVar5->value);
  }
  return;
}

Assistant:

void StatisticsPropagator::UpdateFilterStatistics(Expression &left, Expression &right, ExpressionType comparison_type) {
	// first check if either side is a bound column ref
	// any column ref involved in a comparison will not be null after the comparison
	bool compare_distinct = IsCompareDistinct(comparison_type);
	if (!compare_distinct && left.GetExpressionType() == ExpressionType::BOUND_COLUMN_REF) {
		SetStatisticsNotNull((left.Cast<BoundColumnRefExpression>()).binding);
	}
	if (!compare_distinct && right.GetExpressionType() == ExpressionType::BOUND_COLUMN_REF) {
		SetStatisticsNotNull((right.Cast<BoundColumnRefExpression>()).binding);
	}
	// check if this is a comparison between a constant and a column ref
	optional_ptr<BoundConstantExpression> constant;
	optional_ptr<BoundColumnRefExpression> columnref;
	if (left.GetExpressionType() == ExpressionType::VALUE_CONSTANT &&
	    right.GetExpressionType() == ExpressionType::BOUND_COLUMN_REF) {
		constant = &left.Cast<BoundConstantExpression>();
		columnref = &right.Cast<BoundColumnRefExpression>();
		comparison_type = FlipComparisonExpression(comparison_type);
	} else if (left.GetExpressionType() == ExpressionType::BOUND_COLUMN_REF &&
	           right.GetExpressionType() == ExpressionType::VALUE_CONSTANT) {
		columnref = &left.Cast<BoundColumnRefExpression>();
		constant = &right.Cast<BoundConstantExpression>();
	} else if (left.GetExpressionType() == ExpressionType::BOUND_COLUMN_REF &&
	           right.GetExpressionType() == ExpressionType::BOUND_COLUMN_REF) {
		// comparison between two column refs
		auto &left_column_ref = left.Cast<BoundColumnRefExpression>();
		auto &right_column_ref = right.Cast<BoundColumnRefExpression>();
		auto lentry = statistics_map.find(left_column_ref.binding);
		auto rentry = statistics_map.find(right_column_ref.binding);
		if (lentry == statistics_map.end() || rentry == statistics_map.end()) {
			return;
		}
		UpdateFilterStatistics(*lentry->second, *rentry->second, comparison_type);
	} else {
		// unsupported filter
		return;
	}
	if (constant && columnref) {
		// comparison between columnref
		auto entry = statistics_map.find(columnref->binding);
		if (entry == statistics_map.end()) {
			return;
		}
		UpdateFilterStatistics(*entry->second, comparison_type, constant->value);
	}
}